

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ErrorCode __thiscall
ComponentManager::GetService(ComponentManager *this,CID cid,IID iid,void **object)

{
  Node *pNVar1;
  ClassInfo *other;
  ISupports *pIVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Node *pNVar5;
  ErrorCode result;
  void **local_48;
  ClassInfo match;
  
  result = kNoError;
  match.mClass = (ISupports *)0x0;
  pNVar5 = (this->mClasses).mHead;
  pNVar1 = (this->mClasses).mTail;
  local_48 = object;
  match.mCid.mId = cid.mId;
  do {
    pNVar5 = pNVar5->next;
    if (pNVar5 == pNVar1) {
      return kNoClass;
    }
    other = pNVar5->val;
    bVar3 = JHCOM::ComId::operator==(&match.mCid,&other->mCid);
  } while (!bVar3);
  pIVar2 = other->mClass;
  iVar4 = (*pIVar2->_vptr_ISupports[2])(pIVar2,iid.mId,&result);
  *local_48 = (void *)CONCAT44(extraout_var,iVar4);
  return result;
}

Assistant:

ErrorCode ComponentManager::GetService( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;
	ClassInfo match( cid );

	ClassInfo *info = NULL;

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			info = *i;
			break;
		}
	}
	
	LOG( "info is %p", info );
	
	if ( info != NULL )
		*object = info->mClass->QueryInterface( iid, &result );
	else
		result = kNoClass;

	return result;
}